

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::LongStressCaseInternal::Program::disableAttributeArray
          (Program *this,VarSpec *attrSpec,string *shaderNameManglingSuffix)

{
  GLuint GVar1;
  string local_30;
  
  GVar1 = this->m_programGL;
  mangleShaderNames(&local_30,&attrSpec->name,shaderNameManglingSuffix);
  GVar1 = glwGetAttribLocation(GVar1,local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  glwDisableVertexAttribArray(GVar1);
  return;
}

Assistant:

void Program::disableAttributeArray (const VarSpec& attrSpec, const string& shaderNameManglingSuffix) const
{
	const int attrLoc = glGetAttribLocation(m_programGL, mangleShaderNames(attrSpec.name, shaderNameManglingSuffix).c_str());

	glDisableVertexAttribArray(attrLoc);
}